

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O2

bool pvmath::houghTransform<double>(void)

{
  double maximum;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong __n;
  uint uVar8;
  pointer pPVar9;
  undefined1 auVar10 [16];
  double __x;
  double angleTolerance;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_ZMM4 [64];
  undefined8 in_XMM5_Qb;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> pointOffLine;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> point;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> pointOnLine;
  double local_48;
  
  uVar8 = 0;
  do {
    uVar4 = Test_Helper::runCount();
    if (uVar4 <= uVar8) {
LAB_0017c651:
      return uVar4 <= uVar8;
    }
    iVar5 = rand();
    __x = toRadians((double)(iVar5 % 0x168 + -0xb4));
    iVar5 = rand();
    auVar15._0_8_ = (double)(iVar5 % 99);
    auVar15._8_8_ = in_ZMM4._8_8_;
    auVar15 = vfmadd213sd_fma(auVar15,ZEXT816(0x3fb99999a0000000),ZEXT816(0));
    angleTolerance = toRadians(auVar15._0_8_ + 0.10000000149011612);
    uVar6 = rand();
    iVar5 = rand();
    auVar10._0_8_ = (double)(iVar5 % 0x1ea);
    auVar10._8_8_ = in_ZMM4._8_8_;
    auVar15 = vfmadd132sd_fma(auVar10,ZEXT816(0x3fb99999a0000000),ZEXT816(0x3f847ae140000000));
    maximum = auVar15._0_8_ * 0.5;
    uVar7 = rand();
    __n = (ulong)uVar7 % 100;
    if ((uint)__n < 0x33) {
      __n = 0x32;
    }
    std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::vector
              (&point,__n,(allocator_type *)&pointOnLine);
    dVar11 = sin(__x);
    dVar12 = cos(__x);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = maximum;
    auVar1._8_8_ = 0x8000000000000000;
    auVar1._0_8_ = 0x8000000000000000;
    auVar10 = vxorpd_avx512vl(auVar2,auVar1);
    for (pPVar9 = point.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pPVar9 != point.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pPVar9 = pPVar9 + 1) {
      iVar5 = rand();
      auVar17._0_8_ = (double)(iVar5 % 200000);
      auVar17._8_8_ = in_XMM5_Qb;
      auVar1 = vfmadd132sd_fma(auVar17,ZEXT816(0xc08f400000000000),ZEXT816(0x3f847ae140000000));
      local_48 = auVar10._0_8_;
      dVar13 = Unit_Test::randomFloatValue<double>(local_48,maximum,maximum / 10.0);
      dVar14 = Unit_Test::randomFloatValue<double>(local_48,maximum,maximum / 10.0);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar11;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar12;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar13 + auVar1._0_8_;
      in_ZMM4 = ZEXT1664(auVar21);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar11 * dVar14;
      auVar2 = vfmsub231sd_fma(auVar18,auVar21,auVar20);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar12 * dVar14;
      auVar1 = vfmadd231sd_fma(auVar16,auVar19,auVar21);
      pPVar9->x = auVar2._0_8_;
      pPVar9->y = auVar1._0_8_;
    }
    pointOnLine.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pointOffLine.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pointOnLine.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pointOnLine.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pointOffLine.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pointOffLine.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar3 = Image_Function::HoughTransform
                      (&point,__x,angleTolerance,
                       angleTolerance / (double)(uVar6 % 0x32 + (uint)(uVar6 % 0x32 == 0)),
                       auVar15._0_8_,&pointOnLine,
                       (vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
                       &pointOffLine.
                        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                      );
    if ((!bVar3) ||
       (pointOffLine.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        pointOffLine.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      std::_Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::~_Vector_base
                (&pointOffLine.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>);
      std::_Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::~_Vector_base
                (&pointOnLine.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>);
      std::_Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::~_Vector_base
                (&point.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>);
      goto LAB_0017c651;
    }
    std::_Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::~_Vector_base
              (&pointOffLine.
                super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>);
    std::_Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::~_Vector_base
              ((_Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
               &pointOnLine);
    std::_Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::~_Vector_base
              (&point.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
              );
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

bool houghTransform()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const _Type angle = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>(-180, 180, 1 ) ) );
            const _Type angleTolerance = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>( 0, 10, 0.1f ) + 0.1f ) );
            const _Type angleStep = angleTolerance / Unit_Test::randomValue( 1, 50 );
            const _Type lineTolerance = Unit_Test::randomFloatValue<_Type>( 0.1f, 5, 0.01f );

            const _Type noiseValue = lineTolerance / 2;
            std::vector< PointBase2D<_Type> > point( Unit_Test::randomValue<uint32_t>( 50u, 100u ) );

            const _Type sinVal = std::sin( angle );
            const _Type cosVal = std::cos( angle );

            for ( typename std::vector< PointBase2D<_Type> >::iterator p = point.begin(); p != point.end(); ++p ) {
                const _Type x = Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) + Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );
                const _Type y = Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );

                p->x = x * cosVal - y * sinVal;
                p->y = x * sinVal + y * cosVal;
            }

            std::vector< PointBase2D<_Type> > pointOnLine;
            std::vector< PointBase2D<_Type> > pointOffLine;

            if ( !Image_Function::HoughTransform( point, angle, angleTolerance, angleStep, lineTolerance, pointOnLine, pointOffLine ) ||
                 !pointOffLine.empty() )
                return false;
        }

        return true;
    }